

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRRect.cpp
# Opt level: O2

ssize_t __thiscall MinVR::VRRect::write(VRRect *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  VRDataIndex *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  this_00 = (VRDataIndex *)CONCAT44(in_register_00000034,__fd);
  std::operator+(&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf,
                 "/xOffset");
  VRDataIndex::addData(&local_40,this_00,&local_e0,this->m_xOffset);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::operator+(&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf,
                 "/yOffset");
  VRDataIndex::addData(&local_60,this_00,&local_e0,this->m_yOffset);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::operator+(&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf,"/width"
                );
  VRDataIndex::addData(&local_80,this_00,&local_e0,this->m_width);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_e0);
  std::operator+(&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf,
                 "/height");
  VRDataIndex::addData(&local_a0,this_00,&local_e0,this->m_height);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::operator+(&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf,
                 "/usePercent");
  VRDataIndex::addData(&local_c0,this_00,&local_e0,(uint)this->m_usePercent);
  std::__cxx11::string::~string((string *)&local_c0);
  sVar1 = std::__cxx11::string::~string((string *)&local_e0);
  return sVar1;
}

Assistant:

void VRRect::write(VRDataIndex& index, std::string name) const {
	index.addData(name + "/xOffset", m_xOffset);
	index.addData(name + "/yOffset", m_yOffset);
	index.addData(name + "/width", m_width);
	index.addData(name + "/height", m_height);
	index.addData(name + "/usePercent", m_usePercent);
}